

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O2

void __thiscall
Assimp::X3DImporter::XML_ReadNode_GetAttrVal_AsCol3f
          (X3DImporter *this,int pAttrIdx,aiColor3D *pValue)

{
  FIReader *pFVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined8 extraout_RAX;
  vector<float,_std::allocator<float>_> tlist;
  allocator<char> local_59;
  _Vector_base<float,_std::allocator<float>_> local_58;
  string local_38;
  
  local_58._M_impl.super__Vector_impl_data._M_start = (ai_real *)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  XML_ReadNode_GetAttrVal_AsArrF(this,pAttrIdx,(vector<float,_std::allocator<float>_> *)&local_58);
  if ((long)local_58._M_impl.super__Vector_impl_data._M_finish -
      (long)local_58._M_impl.super__Vector_impl_data._M_start == 0xc) {
    pValue->r = *local_58._M_impl.super__Vector_impl_data._M_start;
    pValue->g = local_58._M_impl.super__Vector_impl_data._M_start[1];
    pValue->b = local_58._M_impl.super__Vector_impl_data._M_start[2];
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_58);
    return;
  }
  pFVar1 = (this->mReader)._M_t.
           super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
           super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
           super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
  iVar2 = (*(pFVar1->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                    (pFVar1,pAttrIdx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,(char *)CONCAT44(extraout_var,iVar2),&local_59);
  Throw_ConvertFail_Str2ArrF(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_58);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void X3DImporter::XML_ReadNode_GetAttrVal_AsCol3f(const int pAttrIdx, aiColor3D& pValue)
{
    std::vector<float> tlist;
    std::vector<float>::iterator it;

	XML_ReadNode_GetAttrVal_AsArrF(pAttrIdx, tlist);
	if(tlist.size() != 3) Throw_ConvertFail_Str2ArrF(mReader->getAttributeValue(pAttrIdx));

	it = tlist.begin();
	pValue.r = *it++;
	pValue.g = *it++;
	pValue.b = *it;
}